

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O2

int Ivy_ManSetLevels_rec(Ivy_Obj_t *pObj,int fHaig)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  Ivy_Obj_t *pIVar6;
  
  uVar1 = *(uint *)&pObj->field_0x8;
  if ((uVar1 & 0x10) == 0) {
    *(uint *)&pObj->field_0x8 = uVar1 | 0x10;
    uVar2 = 0;
    if (pObj->Id != 0) {
      uVar1 = uVar1 & 0xf;
      if (uVar1 - 5 < 3) {
        Ivy_ManSetLevels_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),fHaig);
        uVar1 = *(uint *)&pObj->field_0x8;
        if ((uVar1 & 0xf) != 7) {
          Ivy_ManSetLevels_rec((Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),fHaig);
          uVar1 = *(uint *)&pObj->field_0x8;
        }
        uVar2 = uVar1 & 0xf;
        if (uVar2 == 7) {
          uVar2 = (*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 8) & 0xfffff800) + 0x800;
          uVar3 = 0x7f7;
        }
        else {
          if (uVar2 - 7 < 0xfffffffe) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                          ,0x1ab,"int Ivy_ManSetLevels_rec(Ivy_Obj_t *, int)");
          }
          uVar4 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
          uVar5 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
          if (*(uint *)(uVar5 + 8) >> 0xb < *(uint *)(uVar4 + 8) >> 0xb) {
            uVar5 = uVar4;
          }
          uVar2 = (uint)(uVar2 == 6) * 0x800 + *(int *)(uVar5 + 8) + 0x800 & 0xfffff800;
          uVar3 = 0x7ff;
        }
        uVar1 = uVar1 & uVar3 | uVar2;
        *(uint *)&pObj->field_0x8 = uVar1;
        if (((fHaig != 0) && (pIVar6 = pObj->pEquiv, pIVar6 != (Ivy_Obj_t *)0x0)) &&
           (0 < pObj->nRefs)) {
          uVar2 = uVar2 >> 0xb;
          for (; pIVar6 != pObj; pIVar6 = (Ivy_Obj_t *)((ulong)pIVar6->pEquiv & 0xfffffffffffffffe))
          {
            Ivy_ManSetLevels_rec(pIVar6,fHaig);
            uVar1 = *(uint *)&pIVar6->field_0x8 >> 0xb;
            if (uVar2 <= uVar1) {
              uVar2 = uVar1;
            }
          }
          *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0x7ff | uVar2 << 0xb;
          for (pIVar6 = pObj->pEquiv; pIVar6 != pObj;
              pIVar6 = (Ivy_Obj_t *)((ulong)pIVar6->pEquiv & 0xfffffffffffffffe)) {
            *(uint *)&pIVar6->field_0x8 = *(uint *)&pIVar6->field_0x8 & 0x7ff | uVar2 << 0xb;
          }
          uVar1 = *(uint *)&pObj->field_0x8;
        }
        uVar2 = uVar1 >> 0xb;
      }
      else if ((uVar1 != 1) && (uVar2 = 0, uVar1 != 4)) {
        __assert_fail("Ivy_ObjIsBuf(pObj) || Ivy_ObjIsAnd(pObj) || Ivy_ObjIsExor(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                      ,0x1a1,"int Ivy_ManSetLevels_rec(Ivy_Obj_t *, int)");
      }
    }
  }
  else {
    uVar2 = uVar1 >> 0xb;
  }
  return uVar2;
}

Assistant:

int Ivy_ManSetLevels_rec( Ivy_Obj_t * pObj, int fHaig )
{
    // quit if the node is visited
    if ( Ivy_ObjIsMarkA(pObj) )
        return pObj->Level;
    Ivy_ObjSetMarkA(pObj);
    // quit if this is a CI
    if ( Ivy_ObjIsConst1(pObj) || Ivy_ObjIsCi(pObj) )
        return 0;
    assert( Ivy_ObjIsBuf(pObj) || Ivy_ObjIsAnd(pObj) || Ivy_ObjIsExor(pObj) );
    // get levels of the fanins
    Ivy_ManSetLevels_rec( Ivy_ObjFanin0(pObj), fHaig );
    if ( !Ivy_ObjIsBuf(pObj) )
        Ivy_ManSetLevels_rec( Ivy_ObjFanin1(pObj), fHaig );
    // get level of the node
    if ( Ivy_ObjIsBuf(pObj) )
        pObj->Level = 1 + Ivy_ObjFanin0(pObj)->Level;
    else if ( Ivy_ObjIsNode(pObj) )
        pObj->Level = Ivy_ObjLevelNew( pObj );
    else assert( 0 );
    // get level of other choices
    if ( fHaig && pObj->pEquiv && Ivy_ObjRefs(pObj) > 0 )
    {
        Ivy_Obj_t * pTemp;
        unsigned LevelMax = pObj->Level;
        for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
        {
            Ivy_ManSetLevels_rec( pTemp, fHaig );
            LevelMax = IVY_MAX( LevelMax, pTemp->Level );
        }
        // get this level
        pObj->Level = LevelMax;
        for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
            pTemp->Level = LevelMax;
    }
    return pObj->Level;
}